

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_FieldOptionNameError_Test::
~ParserValidationErrorTest_FieldOptionNameError_Test
          (ParserValidationErrorTest_FieldOptionNameError_Test *this)

{
  ParserValidationErrorTest_FieldOptionNameError_Test *this_local;
  
  ~ParserValidationErrorTest_FieldOptionNameError_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, FieldOptionNameError) {
  ExpectHasValidationErrors(
      "message Foo {\n"
      "  optional bool bar = 1 [foo=1];\n"
      "}\n",
      "1:25: Option \"foo\" unknown. Ensure that your proto definition file "
      "imports the proto which defines the option.\n");
}